

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::WriteBLASCompactedSize
          (DeviceContextVkImpl *this,WriteBLASCompactedSizeAttribs *Attribs)

{
  BottomLevelASVkImpl *BLAS;
  BufferVkImpl *Buffer;
  VkQueryPool_T *pVVar1;
  VkAccelerationStructureKHR accelerationStructure;
  VkBuffer dstBuffer;
  char *OpName;
  BufferVkImpl *pDestBuffVk;
  BottomLevelASVkImpl *pBLASVk;
  Uint32 QueryIndex;
  WriteBLASCompactedSizeAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::WriteBLASCompactedSize
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  BLAS = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(Attribs->pBLAS);
  Buffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Attribs->pDestBuffer);
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBLASState
            (this,BLAS,Attribs->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
             "Write AS compacted size (DeviceContextVkImpl::WriteBLASCompactedSize)");
  TransitionOrVerifyBufferState
            (this,Buffer,Attribs->BufferTransitionMode,RESOURCE_STATE_COPY_DEST,
             VK_ACCESS_TRANSFER_WRITE_BIT,
             "Write AS compacted size (DeviceContextVkImpl::WriteBLASCompactedSize)");
  pVVar1 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkQueryPool_T_
                     ((VulkanObjectWrapper *)&this->m_ASQueryPool);
  VulkanUtilities::VulkanCommandBuffer::ResetQueryPool(&this->m_CommandBuffer,pVVar1,0,1);
  accelerationStructure = BottomLevelASVkImpl::GetVkBLAS(BLAS);
  pVVar1 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkQueryPool_T_
                     ((VulkanObjectWrapper *)&this->m_ASQueryPool);
  VulkanUtilities::VulkanCommandBuffer::WriteAccelerationStructuresProperties
            (&this->m_CommandBuffer,accelerationStructure,
             VK_QUERY_TYPE_ACCELERATION_STRUCTURE_COMPACTED_SIZE_KHR,pVVar1,0);
  pVVar1 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkQueryPool_T_
                     ((VulkanObjectWrapper *)&this->m_ASQueryPool);
  dstBuffer = BufferVkImpl::GetVkBuffer(Buffer);
  VulkanUtilities::VulkanCommandBuffer::CopyQueryPoolResults
            (&this->m_CommandBuffer,pVVar1,0,1,dstBuffer,Attribs->DestBufferOffset,8,3);
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::WriteBLASCompactedSize(const WriteBLASCompactedSizeAttribs& Attribs)
{
    TDeviceContextBase::WriteBLASCompactedSize(Attribs, 0);

    const Uint32         QueryIndex  = 0;
    BottomLevelASVkImpl* pBLASVk     = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pBLAS);
    BufferVkImpl*        pDestBuffVk = ClassPtrCast<BufferVkImpl>(Attribs.pDestBuffer);

    EnsureVkCmdBuffer();

    const char* OpName = "Write AS compacted size (DeviceContextVkImpl::WriteBLASCompactedSize)";
    TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
    TransitionOrVerifyBufferState(*pDestBuffVk, Attribs.BufferTransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, OpName);

    m_CommandBuffer.ResetQueryPool(m_ASQueryPool, QueryIndex, 1);
    m_CommandBuffer.WriteAccelerationStructuresProperties(pBLASVk->GetVkBLAS(), VK_QUERY_TYPE_ACCELERATION_STRUCTURE_COMPACTED_SIZE_KHR, m_ASQueryPool, QueryIndex);
    m_CommandBuffer.CopyQueryPoolResults(m_ASQueryPool, QueryIndex, 1, pDestBuffVk->GetVkBuffer(), Attribs.DestBufferOffset, sizeof(Uint64), VK_QUERY_RESULT_64_BIT | VK_QUERY_RESULT_WAIT_BIT);
    ++m_State.NumCommands;
}